

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::SetProperty(cmMakefile *this,string *prop,char *value)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  char *__s1;
  char *__s2;
  allocator local_261;
  string local_260;
  undefined1 local_240 [8];
  cmValueWithOrigin entry;
  cmListFileBacktrace lfbt_2;
  string local_1b8;
  cmValueWithOrigin local_198;
  undefined1 local_148 [8];
  cmListFileBacktrace lfbt_1;
  string local_110;
  cmValueWithOrigin local_f0;
  undefined1 local_a0 [8];
  cmListFileBacktrace lfbt;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  char *value_local;
  string *prop_local;
  cmMakefile *this_local;
  
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)value;
  bVar2 = std::operator==(prop,"LINK_DIRECTORIES");
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
    pbVar1 = varArgsExpanded.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,(char *)pbVar1,&local_59);
      cmSystemTools::ExpandListArgument
                (&local_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38,false);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    SetLinkDirectories(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
  }
  else {
    bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
    if (bVar2) {
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
                (&this->IncludeDirectoriesEntries);
      if (varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        GetBacktrace((cmListFileBacktrace *)local_a0,this);
        pbVar1 = varArgsExpanded.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_110,(char *)pbVar1,
                   (allocator *)((long)&lfbt_1.Snapshot.Position.Position + 7));
        cmValueWithOrigin::cmValueWithOrigin(&local_f0,&local_110,(cmListFileBacktrace *)local_a0);
        std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                  (&this->IncludeDirectoriesEntries,&local_f0);
        cmValueWithOrigin::~cmValueWithOrigin(&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&lfbt_1.Snapshot.Position.Position + 7));
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a0);
      }
    }
    else {
      bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
      if (bVar2) {
        std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
                  (&this->CompileOptionsEntries);
        if (varArgsExpanded.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          GetBacktrace((cmListFileBacktrace *)local_148,this);
          pbVar1 = varArgsExpanded.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1b8,(char *)pbVar1,
                     (allocator *)((long)&lfbt_2.Snapshot.Position.Position + 7));
          cmValueWithOrigin::cmValueWithOrigin
                    (&local_198,&local_1b8,(cmListFileBacktrace *)local_148);
          std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                    (&this->CompileOptionsEntries,&local_198);
          cmValueWithOrigin::~cmValueWithOrigin(&local_198);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&lfbt_2.Snapshot.Position.Position + 7));
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_148);
        }
      }
      else {
        bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
        if (bVar2) {
          std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
                    (&this->CompileDefinitionsEntries);
          if (varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            GetBacktrace((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position,this);
            pbVar1 = varArgsExpanded.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_260,(char *)pbVar1,&local_261);
            cmValueWithOrigin::cmValueWithOrigin
                      ((cmValueWithOrigin *)local_240,&local_260,
                       (cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
            std::__cxx11::string::~string((string *)&local_260);
            std::allocator<char>::~allocator((allocator<char> *)&local_261);
            std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                      (&this->CompileDefinitionsEntries,(value_type *)local_240);
            cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)local_240);
            cmListFileBacktrace::~cmListFileBacktrace
                      ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
          }
        }
        else {
          bVar2 = std::operator==(prop,"INCLUDE_REGULAR_EXPRESSION");
          if (bVar2) {
            SetIncludeRegularExpression
                      (this,(char *)varArgsExpanded.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            bVar2 = std::operator==(prop,"ADDITIONAL_MAKE_CLEAN_FILES");
            if (bVar2) {
              __s1 = GetCurrentSourceDirectory(this);
              __s2 = GetCurrentSourceDirectory(this);
              iVar3 = strcmp(__s1,__s2);
              if (iVar3 != 0) {
                return;
              }
            }
            cmPropertyMap::SetProperty
                      (&this->Properties,prop,
                       (char *)varArgsExpanded.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmMakefile::SetProperty(const std::string& prop, const char* value)
{
  if ( prop == "LINK_DIRECTORIES" )
    {
    std::vector<std::string> varArgsExpanded;
    if(value)
      {
      cmSystemTools::ExpandListArgument(value, varArgsExpanded);
      }
    this->SetLinkDirectories(varArgsExpanded);
    return;
    }
  if (prop == "INCLUDE_DIRECTORIES")
    {
    this->IncludeDirectoriesEntries.clear();
      if (!value)
        {
        return;
        }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->IncludeDirectoriesEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    this->CompileOptionsEntries.clear();
      if (!value)
        {
        return;
        }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileOptionsEntries.push_back(cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    this->CompileDefinitionsEntries.clear();
    if (!value)
      {
      return;
      }
    cmListFileBacktrace lfbt = this->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->CompileDefinitionsEntries.push_back(entry);
    return;
    }

  if ( prop == "INCLUDE_REGULAR_EXPRESSION" )
    {
    this->SetIncludeRegularExpression(value);
    return;
    }

  if ( prop == "ADDITIONAL_MAKE_CLEAN_FILES" )
    {
    // This property is not inherrited
    if ( strcmp(this->GetCurrentSourceDirectory(),
                this->GetCurrentSourceDirectory()) != 0 )
      {
      return;
      }
    }

  this->Properties.SetProperty(prop, value);
}